

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

U32 * COVER_map_at(COVER_map_t *map,U32 key)

{
  COVER_map_pair_t *pCVar1;
  byte bVar2;
  uint uVar3;
  U32 *pUVar4;
  ulong uVar5;
  bool bVar6;
  
  pCVar1 = map->data;
  bVar2 = -(char)map->sizeLog;
  uVar5 = (ulong)bVar2;
  uVar3 = key * -0x61c8864f >> (bVar2 & 0x1f);
  while( true ) {
    if (pCVar1[uVar3].value == 0xffffffff) {
      bVar6 = false;
      uVar5 = (ulong)uVar3;
    }
    else {
      bVar6 = pCVar1[uVar3].key != key;
      if (!bVar6) {
        uVar5 = (ulong)uVar3;
      }
    }
    if (!bVar6) break;
    uVar3 = uVar3 + 1 & map->sizeMask;
  }
  pUVar4 = &pCVar1[uVar5].value;
  if (*pUVar4 == 0xffffffff) {
    pCVar1[uVar5].key = key;
    pCVar1[uVar5].value = 0;
    return pUVar4;
  }
  return pUVar4;
}

Assistant:

static U32 *COVER_map_at(COVER_map_t *map, U32 key) {
  COVER_map_pair_t *pos = &map->data[COVER_map_index(map, key)];
  if (pos->value == MAP_EMPTY_VALUE) {
    pos->key = key;
    pos->value = 0;
  }
  return &pos->value;
}